

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

void Seg_ManComputeDelay(Gia_Man_t *pGia,int DelayInit,int nFanouts,int fTwo,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  sat_solver *psVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Seg_Man_t *p;
  int *pVars;
  Vec_Int_t *vArray;
  ulong uVar12;
  Gia_Man_t *pGVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  char *__format;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  timespec ts;
  uint local_54;
  timespec local_48;
  long local_38;
  
  iVar7 = clock_gettime(3,&local_48);
  if (iVar7 < 0) {
    local_38 = -1;
  }
  else {
    local_38 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p = Seg_ManAlloc(pGia,nFanouts);
  uVar16 = p->nVars;
  uVar8 = 0x10;
  if (0xe < uVar16 - 1) {
    uVar8 = uVar16;
  }
  if (uVar8 == 0) {
    pVars = (int *)0x0;
  }
  else {
    pVars = (int *)malloc((long)(int)uVar8 << 2);
  }
  auVar6 = _DAT_008403e0;
  if (0 < (int)uVar16) {
    lVar15 = (ulong)uVar16 - 1;
    auVar17._8_4_ = (int)lVar15;
    auVar17._0_8_ = lVar15;
    auVar17._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar12 = 0;
    auVar17 = auVar17 ^ _DAT_008403e0;
    auVar18 = _DAT_008403d0;
    do {
      auVar19 = auVar18 ^ auVar6;
      if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                  auVar17._4_4_ < auVar19._4_4_) & 1)) {
        pVars[uVar12] = (int)uVar12;
      }
      if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
          auVar19._12_4_ <= auVar17._12_4_) {
        pVars[uVar12 + 1] = (int)uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar15 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar15 + 2;
    } while ((uVar16 + 1 & 0xfffffffe) != uVar12);
  }
  local_54 = DelayInit;
  if (DelayInit == 0) {
    local_54 = p->DelayMax;
  }
  if (fVerbose == 0) {
    iVar7 = 0;
  }
  else {
    sat_solver_nvars(p->pSat);
    printf("Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n",
           (ulong)local_54,(ulong)(fTwo + 1));
    iVar7 = fVerbose;
  }
  Seg_ManCreateCnf(p,fTwo,iVar7);
  sat_solver_set_resource_limits(p->pSat,0,0,0,0);
  psVar2 = p->pSat;
  psVar2->nRuntimeLimit = 0;
  psVar2->fNotUseRandom = 1;
  piVar3 = p->vPolars->pArray;
  uVar8 = p->vPolars->nSize;
  if (0 < psVar2->size) {
    lVar15 = 0;
    do {
      psVar2->polarity[lVar15] = '\0';
      lVar15 = lVar15 + 1;
    } while (lVar15 < psVar2->size);
  }
  if (0 < (int)uVar8) {
    uVar12 = 0;
    do {
      psVar2->polarity[piVar3[uVar12]] = '\x01';
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
  }
  sat_solver_set_var_activity(p->pSat,pVars,uVar16);
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  if (p->DelayMax < 0) {
    Gia_ManEdgeFromArray(p->pGia,(Vec_Int_t *)0x0);
  }
  else {
    vArray = (Vec_Int_t *)0x0;
    uVar16 = p->DelayMax;
    do {
      pGVar13 = p->pGia;
      pVVar14 = pGVar13->vCos;
      iVar7 = pVVar14->nSize;
      lVar15 = 0;
      if (0 < iVar7) {
        lVar15 = 0;
        do {
          iVar7 = pVVar14->pArray[lVar15];
          if (((long)iVar7 < 0) || (pGVar13->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar4 = pGVar13->pObjs;
          pGVar1 = pGVar4 + iVar7 + -(ulong)((uint)*(undefined8 *)(pGVar4 + iVar7) & 0x1fffffff);
          if ((pGVar1 < pGVar4) || (pGVar4 + (uint)pGVar13->nObjs <= pGVar1)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar8 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
          if ((((int)uVar8 < 0) || (p->vFirsts->nSize <= (int)uVar8)) ||
             (p->vNvars->nSize <= (int)uVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((int)uVar16 < p->vNvars->pArray[uVar8 & 0x7fffffff]) {
            iVar7 = p->vFirsts->pArray[uVar8 & 0x7fffffff] + uVar16;
            if (iVar7 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf1,"int Abc_Var2Lit(int, int)");
            }
            iVar7 = sat_solver_push(p->pSat,iVar7 * 2 + 1);
            pGVar13 = p->pGia;
            if (iVar7 == 0) {
              iVar7 = pGVar13->vCos->nSize;
              break;
            }
          }
          lVar15 = lVar15 + 1;
          pVVar14 = pGVar13->vCos;
          iVar7 = pVVar14->nSize;
        } while (lVar15 < iVar7);
      }
      if ((int)lVar15 < iVar7) {
        printf("Proved UNSAT for delay %d.  ",(ulong)uVar16);
        iVar9 = 3;
        iVar7 = clock_gettime(3,&local_48);
        if (iVar7 < 0) {
LAB_00752190:
          lVar15 = -1;
        }
        else {
LAB_00752121:
          lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        lVar15 = lVar15 - local_38;
        Abc_Print(iVar9,"%s =","Time");
        Abc_Print(iVar9,"%9.2f sec\n",(double)lVar15 / 1000000.0);
        break;
      }
      if ((int)uVar16 <= (int)local_54) {
        iVar7 = sat_solver_nconflicts(p->pSat);
        iVar9 = sat_solver_solve_internal(p->pSat);
        iVar10 = sat_solver_nconflicts(p->pSat);
        if (iVar9 != 1) {
          if (fVerbose != 0) {
            __format = "Resource limit reached for delay %d.  ";
            if (iVar9 == -1) {
              __format = "Proved UNSAT for delay %d.  ";
            }
            printf(__format,(ulong)uVar16);
            iVar9 = 3;
            iVar7 = clock_gettime(3,&local_48);
            if (-1 < iVar7) goto LAB_00752121;
            goto LAB_00752190;
          }
          break;
        }
        if (fVerbose != 0) {
          if (p->nVars < 1) {
            uVar8 = 0;
          }
          else {
            uVar8 = 0;
            iVar9 = 0;
            do {
              iVar11 = sat_solver_var_value(p->pSat,iVar9);
              uVar8 = uVar8 + iVar11;
              iVar9 = iVar9 + 1;
            } while (iVar9 < p->nVars);
          }
          printf("Solution with delay %2d and %5d edges exists. Conf = %8d.  ",(ulong)uVar16,
                 (ulong)uVar8,(ulong)(uint)(iVar10 - iVar7));
          iVar9 = 3;
          iVar7 = clock_gettime(3,&local_48);
          if (iVar7 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
          }
          lVar15 = lVar15 - local_38;
          Abc_Print(iVar9,"%s =","Time");
          Abc_Print(iVar9,"%9.2f sec\n",(double)lVar15 / 1000000.0);
        }
        if (vArray != (Vec_Int_t *)0x0) {
          if (vArray->pArray != (int *)0x0) {
            free(vArray->pArray);
          }
          free(vArray);
        }
        vArray = Seg_ManConvertResult(p);
      }
      bVar5 = 0 < (int)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar5);
    Gia_ManEdgeFromArray(p->pGia,vArray);
    if (vArray != (Vec_Int_t *)0x0) {
      if (vArray->pArray != (int *)0x0) {
        free(vArray->pArray);
      }
      free(vArray);
    }
  }
  Seg_ManStop(p);
  return;
}

Assistant:

void Seg_ManComputeDelay( Gia_Man_t * pGia, int DelayInit, int nFanouts, int fTwo, int fVerbose )
{
    int nBTLimit = 0;
    int nTimeOut = 0;
    int fVeryVerbose = 0;

    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    Vec_Int_t * vEdges2 = NULL;
    int i, iLut, iFirst, nVars, status, Delay, nConfs;
    Seg_Man_t * p = Seg_ManAlloc( pGia, nFanouts );
    Vec_Int_t * vVars = Vec_IntStartNatural( p->nVars );
    int DelayStart = DelayInit ? DelayInit : p->DelayMax;

    if ( fVerbose )
    printf( "Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n", 
        DelayStart, fTwo+1, p->FirstVar, sat_solver_nvars(p->pSat) );
    Seg_ManCreateCnf( p, fTwo, fVerbose );
    //Sat_SolverWriteDimacs( p->pSat, "test_edge.cnf", NULL, NULL, 0 );
    // set resource limits
    sat_solver_set_resource_limits( p->pSat, nBTLimit, 0, 0, 0 );
    sat_solver_set_runtime_limit( p->pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_set_random( p->pSat, 1 );
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolars), Vec_IntSize(p->vPolars) );
    sat_solver_set_var_activity( p->pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );
    Vec_IntFree( vVars );
    // increment delay gradually
    for ( Delay = p->DelayMax; Delay >= 0; Delay-- )
    {
        // we constrain COs, although it would be fine to constrain only POs
        Gia_ManForEachCoDriver( p->pGia, pObj, i )
        {
            iLut   = Gia_ObjId( p->pGia, pObj );
            iFirst = Vec_IntEntry( p->vFirsts, iLut );
            nVars  = Vec_IntEntry( p->vNvars, iLut );
            if ( Delay < nVars && !sat_solver_push(p->pSat, Abc_Var2Lit(iFirst + Delay, 1)) )
                break;
        }
        if ( i < Gia_ManCoNum(p->pGia) )
        {
            printf( "Proved UNSAT for delay %d.  ", Delay );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            break;
        }
        if ( Delay > DelayStart )
            continue;
        // solve with assumptions
        //clk = Abc_Clock();
        nConfs = sat_solver_nconflicts( p->pSat );
        status = sat_solver_solve_internal( p->pSat );
        nConfs = sat_solver_nconflicts( p->pSat ) - nConfs;
        if ( status == l_True )
        {
            if ( fVerbose )
            {
                int Count = 0;
                for ( i = 0; i < p->nVars; i++ )
                    Count += sat_solver_var_value(p->pSat, i);
                printf( "Solution with delay %2d and %5d edges exists. Conf = %8d.  ", Delay, Count, nConfs );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            // save the result
            Vec_IntFreeP( &vEdges2 );
            vEdges2 = Seg_ManConvertResult( p );
            if ( fVeryVerbose )
            {
                for ( i = 0; i < p->nVars; i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "   " );

                for ( i = p->nVars; i < sat_solver_nvars(p->pSat); i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
            }
        }
        else
        {
            if ( fVerbose )
            {
                if ( status == l_False )
                    printf( "Proved UNSAT for delay %d.  ", Delay );
                else
                    printf( "Resource limit reached for delay %d.  ", Delay );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            break;
        }
    }
    Gia_ManEdgeFromArray( p->pGia, vEdges2 );
    Vec_IntFreeP( &vEdges2 );
    Seg_ManStop( p );
}